

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O2

void __thiscall
visitor_test_should_visit_nested_repeating_groups_Test::
~visitor_test_should_visit_nested_repeating_groups_Test
          (visitor_test_should_visit_nested_repeating_groups_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(visitor_test, should_visit_nested_repeating_groups)
{
    const char* frame = "8=FIX.4.4|9=0000|35=W|49=Prov|56=MDABC|55=AUD/CAD|262=1709|"
                        "711=1|"
                            "311=AUD/CAD|"
                            "457=1|"
                                "458=TESTID|459=TESTSOURCE|"
                            "462=1|"
                        "292=D|268=2|"
                            "269=0|271=500000|272=20170103|299=02z00000hdi:A|"
                            "269=1|271=500000|272=20170103|299=02z00000hdi:A|"
                        "10=213";
    auto err = doVisit(frame, should_visit_nested_repeating_groups::Visitor(), should_visit_nested_repeating_groups::VisitRules());
    ASSERT_TRUE(err.isOk());
}